

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

intptr_t http1_hijack(http_s *h,fio_str_info_s *leftover)

{
  intptr_t uuid_00;
  intptr_t uuid;
  size_t local_48;
  char *local_40;
  undefined8 local_38;
  size_t local_30;
  char *local_28;
  size_t local_20;
  intptr_t len;
  fio_str_info_s *leftover_local;
  http_s *h_local;
  
  len = (intptr_t)leftover;
  leftover_local = (fio_str_info_s *)h;
  if (leftover != (fio_str_info_s *)0x0) {
    local_20 = *(long *)((h->private_data).flag + 0xe8) -
               (*(long *)((h->private_data).flag + 0x58) - ((h->private_data).flag + 0x103));
    if (local_20 == 0) {
      memset(&uuid,0,0x18);
      leftover->capa = uuid;
      leftover->len = local_48;
      leftover->data = local_40;
    }
    else {
      local_38 = 0;
      local_28 = *(char **)((h->private_data).flag + 0x58);
      leftover->capa = 0;
      leftover->len = local_20;
      leftover->data = local_28;
      local_30 = local_20;
    }
  }
  *(undefined1 *)(leftover_local->len + 0x102) = 3;
  uuid_00 = *(intptr_t *)(leftover_local->len + 0x30);
  fio_attach(uuid_00,(fio_protocol_s *)0x0);
  return uuid_00;
}

Assistant:

static intptr_t http1_hijack(http_s *h, fio_str_info_s *leftover) {
  if (leftover) {
    intptr_t len =
        handle2pr(h)->buf_len -
        (intptr_t)(handle2pr(h)->parser.state.next - handle2pr(h)->buf);
    if (len) {
      *leftover = (fio_str_info_s){
          .len = len, .data = (char *)handle2pr(h)->parser.state.next};
    } else {
      *leftover = (fio_str_info_s){.len = 0, .data = NULL};
    }
  }

  handle2pr(h)->stop = 3;
  intptr_t uuid = handle2pr(h)->p.uuid;
  fio_attach(uuid, NULL);
  return uuid;
}